

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O1

void __thiscall CDT::fit(CDT *this)

{
  Matrix<double> *pMVar1;
  double *pdVar2;
  pointer pdVar3;
  undefined4 uVar5;
  pointer pLVar4;
  undefined1 auVar6 [16];
  pointer pIVar7;
  pointer pIVar8;
  ostream *poVar9;
  vector<double,_std::allocator<double>_> *pvVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined4 uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  Shape SVar18;
  vector<double,_std::allocator<double>_> keys;
  vector<Interval,_std::allocator<Interval>_> intervals;
  double output;
  Matrix<double> mat;
  undefined1 local_f8 [16];
  vector<double,_std::allocator<double>_> local_e8;
  char local_c9;
  vector<Interval,_std::allocator<Interval>_> local_c8;
  double local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  Matrix<double> local_90;
  
  local_98 = (this->m_info).bias;
  DataSet::matrix(&local_90,&this->m_dataset);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Dataset bias: ",0xe);
  poVar9 = std::ostream::_M_insert<double>(local_98);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_e8,1);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  if ((this->m_input).m_shape.n_row != 0) {
    uVar12 = 0;
    do {
      local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_c8);
      }
      else {
        *local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = 0.0;
        local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (this->m_input).m_shape.n_row);
  }
  pvVar10 = Matrix<double>::operator[]
                      (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                         super__Vector_impl_data._M_start)->m_weights,0);
  pMVar1 = &this->m_input;
  *(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
   _M_start = 1.0;
  uVar14._0_4_ = (pMVar1->m_shape).n_row;
  uVar14._4_4_ = (pMVar1->m_shape).n_col;
  if (uVar14 >> 0x20 != 1) {
    uVar13 = 0;
    do {
      pvVar10 = Matrix<double>::operator[]
                          (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_weights,0);
      pdVar3 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((pMVar1->m_shape).n_row != 0) {
        uVar14 = 0;
        do {
          pvVar10 = Matrix<double>::operator[]
                              (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->m_weights,0);
          dVar16 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar13];
          local_f8._0_8_ = dVar16;
          pvVar10 = Matrix<double>::operator[](pMVar1,(uint)uVar14);
          local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14] =
               dVar16 * (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar13] +
               local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar14 < (pMVar1->m_shape).n_row);
      }
      uVar13 = uVar13 + 1;
      if ((pMVar1->m_shape).n_row != 1) {
        uVar14 = 0;
        do {
          if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14] <=
              local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14 + 1] &&
              local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14 + 1] !=
              local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14]) {
            uVar12 = (uint)uVar14;
            pvVar10 = Matrix<double>::operator[](pMVar1,uVar12);
            dVar16 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar13];
            local_f8._0_8_ = dVar16;
            pvVar10 = Matrix<double>::operator[](pMVar1,uVar12 + 1);
            pdVar2 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start + uVar13;
            if (*pdVar2 <= dVar16 && dVar16 != *pdVar2) {
              local_a8 = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar14];
              local_f8._0_8_ =
                   local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14 + 1];
              pvVar10 = Matrix<double>::operator[](pMVar1,uVar12);
              dVar16 = ((double)local_f8._0_8_ - local_a8) /
                       (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar13];
              if (dVar16 < pdVar3[uVar13]) {
                pdVar3[uVar13] = dVar16;
              }
            }
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < (pMVar1->m_shape).n_row - 1);
      }
      uVar5 = (pMVar1->m_shape).n_col;
      uVar14._4_4_ = uVar5;
    } while (uVar13 < uVar5 - 1);
  }
  if ((pMVar1->m_shape).n_row != 0) {
    uVar13 = 0;
    do {
      pvVar10 = Matrix<double>::operator[]
                          (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_weights,0);
      dVar16 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar14._4_4_ - 1U];
      local_f8._0_8_ = dVar16;
      pvVar10 = Matrix<double>::operator[](pMVar1,(uint)uVar13);
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar13] =
           dVar16 * (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar14._4_4_ - 1U] +
           local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar13 < (pMVar1->m_shape).n_row);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Updated weights: ",0x11)
  ;
  pLVar4 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pLVar4->m_weights).m_shape.n_col != 0) {
    uVar14 = 0;
    do {
      pvVar10 = Matrix<double>::operator[](&pLVar4->m_weights,0);
      poVar9 = std::ostream::_M_insert<double>
                         ((pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar14]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
      uVar14 = uVar14 + 1;
      pLVar4 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar14 < (pLVar4->m_weights).m_shape.n_col);
  }
  local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_c8,1);
  uVar12 = 0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_f8._8_8_;
  local_f8 = auVar6 << 0x40;
  while( true ) {
    pvVar10 = Matrix<double>::operator[]
                        (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                           _M_impl.super__Vector_impl_data._M_start)->m_weights,0);
    if ((ulong)((long)(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)uVar12) break;
    pvVar10 = Matrix<double>::operator[]
                        (&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                           _M_impl.super__Vector_impl_data._M_start)->m_weights,0);
    local_f8._0_8_ =
         (double)local_f8._0_8_ +
         (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar12] * local_98;
    uVar12 = uVar12 + 1;
  }
  if ((long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar14 = 0;
    do {
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar14] =
           local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar14] - (double)local_f8._0_8_;
      uVar14 = uVar14 + 1;
    } while ((uVar14 & 0xffffffff) <
             (ulong)((long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Key bias: ",10);
  poVar9 = std::ostream::_M_insert<double>((double)local_f8._0_8_);
  local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_c8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," > Initializing intervals...\n",0x1d);
  local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pMVar1 = &this->m_output;
  pvVar10 = Matrix<double>::operator[](pMVar1,0);
  local_b0 = *(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_a8 = 0.0;
    uStack_a0 = 0;
    uVar14 = 0;
    do {
      pvVar10 = Matrix<double>::operator[](pMVar1,(uint)uVar14);
      dVar16 = *(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((dVar16 != local_b0) || (NAN(dVar16) || NAN(local_b0))) {
        std::vector<Interval,std::allocator<Interval>>::emplace_back<double&,double&,double&>
                  ((vector<Interval,std::allocator<Interval>> *)&local_c8,
                   local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   ((long)local_a8 >> 0x3f & (long)(local_a8 - 9.223372036854776e+18) |
                   (long)local_a8),
                   local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   ((long)(double)local_f8._0_8_ >> 0x3f &
                    (long)((double)local_f8._0_8_ - 9.223372036854776e+18) |
                   (long)(double)local_f8._0_8_),&local_b0);
        uVar15 = local_f8._12_4_;
        dVar16 = (double)local_f8._0_8_ + 1.0;
        local_f8._8_4_ = local_f8._8_4_;
        local_f8._0_8_ = dVar16;
        local_f8._12_4_ = uVar15;
        pvVar10 = Matrix<double>::operator[](pMVar1,(uint)(long)dVar16);
        local_b0 = *(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        uStack_a0 = local_f8._8_8_;
        local_a8 = dVar16;
      }
      else {
        local_f8._8_8_ = 0;
        local_f8._0_8_ = (double)uVar14;
      }
      if (((long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) - 1U == uVar14) {
        std::vector<Interval,std::allocator<Interval>>::emplace_back<double&,double&,double&>
                  ((vector<Interval,std::allocator<Interval>> *)&local_c8,
                   local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   ((long)local_a8 >> 0x3f & (long)(local_a8 - 9.223372036854776e+18) |
                   (long)local_a8),
                   local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   ((long)(double)local_f8._0_8_ >> 0x3f &
                    (long)((double)local_f8._0_8_ - 9.223372036854776e+18) |
                   (long)(double)local_f8._0_8_),&local_b0);
      }
      uVar14 = (ulong)((uint)uVar14 + 1);
    } while (uVar14 < (ulong)((long)local_e8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_e8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Overfit rate: ",0xe);
  pIVar8 = local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pIVar7 = local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
           super__Vector_impl_data._M_start;
  SVar18 = DataSet::shape(&this->m_dataset);
  lVar11 = ((long)pIVar8 - (long)pIVar7 >> 3) * -0x5555555555555555;
  auVar17._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar17._0_8_ = lVar11;
  auVar17._12_4_ = 0x45300000;
  poVar9 = std::ostream::_M_insert<double>
                     (((auVar17._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) /
                      (double)SVar18.n_row);
  local_c9 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_c9,1);
  Activation::initialize(&this->m_function,&local_c8);
  if (local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_90.m_elems);
  return;
}

Assistant:

void CDT::fit(){
    double bias=m_info.bias;
    Matrix_d mat=m_dataset.matrix();
    std::cout<<"Dataset bias: "<<bias<<'\n';

    // std::cout<<"dc sort:\n"<<m_input<<'\n'<<m_output<<'\n';

    std::vector<double> keys;
    for(unsigned i=0;i<m_input.shape().n_row;++i)
        keys.push_back(0.);
    
    m_layers[0].m_weights[0][0]=1.;
    for(unsigned i=0;i<m_input.shape().n_col-1;++i){
        double& weight=m_layers[0].m_weights[0][i+1];
        for(unsigned t=0;t<m_input.shape().n_row;++t){
            keys[t]+=m_layers[0].m_weights[0][i]*m_input[t][i];
        }
        for(unsigned j=0;j<m_input.shape().n_row-1;++j){
            if(keys[j]<keys[j+1] &&
               m_input[j][i+1]>m_input[j+1][i+1]){
                   double tmp;
                   tmp=(keys[j+1]-keys[j])/m_input[j][i+1];
                   if(weight>tmp) weight=tmp;
               }
        }
    }
    unsigned col=m_input.shape().n_col;
    for(unsigned i=0;i<m_input.shape().n_row;++i){
        keys[i]+=m_layers[0].m_weights[0][col-1]*m_input[i][col-1];
    }

    std::cout<<"Updated weights: ";
    for(unsigned i=0;i<m_layers[0].m_weights.shape().n_col;++i){
        std::cout<<m_layers[0].m_weights[0][i]<<"\t";
    }   std::cout<<'\n';

    // Normalizing keys
    // std::cout<<"Keys: ";
    // for(unsigned i=0;i<keys.size();++i){
    //     std::cout<<keys[i]<<"\t";
    // } std::cout<<'\n';

    double key_bias=0.;
    for(unsigned i=0;i<m_layers[0].m_weights[0].size();++i){
        // std::cout<<" |> +"<<m_layers[0].m_weights[0][i]<<" * "<<bias<<'\n';
        key_bias+=m_layers[0].m_weights[0][i]*bias;
    }
    for(unsigned i=0;i<keys.size();++i){
        keys[i]-=key_bias;
    }
    
    std::cout<<"Key bias: "<<key_bias<<'\n';
    // std::cout<<"Keys: ";
    // for(unsigned i=0;i<keys.size();++i){
    //     std::cout<<keys[i]<<"\t";
    // }   std::cout<<'\n';

    std::cout<<" > Initializing intervals...\n";
    
    std::vector<Interval> intervals;
    double beg=0, end, output=m_output[0][0];
    for(unsigned i=0;i<keys.size();++i){
        if(m_output[i][0]==output){
            end=i;
        }
        else{
            // std::cout<<" dbg int: "<<keys[beg]<<", "<<keys[end]<<", "<<output<<'\n';
            intervals.emplace_back(keys[beg], keys[end], output);
            
            beg=++end;
            output=m_output[beg][0];
        }

        if(i==keys.size()-1){
            // std::cout<<" dbg int: "<<keys[beg]<<", "<<keys[end]<<", "<<output<<'\n';
            intervals.emplace_back(keys[beg], keys[end], output);
        }
    }
    std::cout<<"Overfit rate: "<<intervals.size()/(double)m_dataset.shape().n_row<<'\n';
    m_function.initialize(intervals);
}